

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall Server::do_udp(Server *this)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  undefined8 extraout_RAX;
  uint uVar6;
  long *plVar7;
  ulong uVar8;
  uint __val;
  undefined1 *unaff_R13;
  uint __len;
  long *unaff_R15;
  string __str;
  sockaddr_un name;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [18];
  sockaddr local_9e [6];
  
  __len = 1;
  iVar3 = socket(1,0x802,0);
  this->udp_fd = iVar3;
  if (iVar3 < 0) {
    do_udp();
  }
  else {
    local_9e[0].sa_family = 1;
    uVar4 = getpid();
    __val = -uVar4;
    if (0 < (int)uVar4) {
      __val = uVar4;
    }
    if (9 < __val) {
      uVar8 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar6 = (uint)uVar8;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_00104c84;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_00104c84;
        }
        if (uVar6 < 10000) goto LAB_00104c84;
        uVar8 = uVar8 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar6);
      __len = __len + 1;
    }
LAB_00104c84:
    unaff_R13 = local_b0;
    local_c0[0] = unaff_R13;
    std::__cxx11::string::_M_construct((ulong)local_c0,(char)__len - (char)((int)uVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>(local_c0[0] + (uVar4 >> 0x1f),__len,__val);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0x1083fb);
    unaff_R15 = &local_f0;
    local_100 = (long *)*plVar5;
    plVar7 = plVar5 + 2;
    if (local_100 == plVar7) {
      local_f0 = *plVar7;
      lStack_e8 = plVar5[3];
      local_100 = unaff_R15;
    }
    else {
      local_f0 = *plVar7;
    }
    local_f8 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_100);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_d0 = *plVar7;
      lStack_c8 = plVar5[3];
      local_e0 = &local_d0;
    }
    else {
      local_d0 = *plVar7;
      local_e0 = (long *)*plVar5;
    }
    plVar1 = local_e0;
    local_d8 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    strcpy(local_9e[0].sa_data,(char *)local_e0);
    if (plVar1 != &local_d0) {
      operator_delete(plVar1);
    }
    if (local_100 != unaff_R15) {
      operator_delete(local_100);
    }
    if (local_c0[0] != unaff_R13) {
      operator_delete(local_c0[0]);
    }
    iVar3 = bind(this->udp_fd,local_9e,0x6e);
    if (-1 < iVar3) {
      return;
    }
  }
  do_udp();
  if (local_100 != unaff_R15) {
    operator_delete(local_100);
  }
  if (local_c0[0] != unaff_R13) {
    operator_delete(local_c0[0]);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Server::do_udp() {
    this->udp_fd = socket(AF_UNIX, SOCK_DGRAM | SOCK_NONBLOCK, 0);
    IF_NEGATIVE_EXIT(this->udp_fd);

    struct sockaddr_un name;

    name.sun_family = AF_UNIX;
    strcpy(name.sun_path, ("/tmp/webed_" + std::to_string(getpid()) + ".sock").c_str());
    IF_NEGATIVE_EXIT(bind(this->udp_fd, (struct sockaddr *) &name, sizeof(struct sockaddr_un)));
}